

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_Check1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Check1_Test *this)

{
  initializer_list<CfdTestFundElementsUtxoVector> __l;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R9;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  CfdException *except;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  char *str_buffer;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  double effective_fee_rate;
  char *output_tx_hex;
  uint32_t append_txout_count;
  int64_t tx_fee_amount;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  CfdTestFundElementsUtxoVector *test_data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *__range2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *fund_handle;
  string fee_asset;
  uint32_t target_asset_count;
  char *tx;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
  *in_stack_fffffffffffff108;
  undefined4 in_stack_fffffffffffff110;
  undefined4 in_stack_fffffffffffff114;
  undefined4 in_stack_fffffffffffff118;
  undefined4 in_stack_fffffffffffff11c;
  undefined4 in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff124;
  void **in_stack_fffffffffffff128;
  undefined4 in_stack_fffffffffffff130;
  undefined4 in_stack_fffffffffffff134;
  undefined4 in_stack_fffffffffffff138;
  undefined4 in_stack_fffffffffffff13c;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
  *in_stack_fffffffffffff140;
  iterator in_stack_fffffffffffff148;
  char *in_stack_fffffffffffff150;
  AssertionResult *this_00;
  undefined4 in_stack_fffffffffffff1a0;
  void *in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1d7;
  double in_stack_fffffffffffff1d8;
  undefined4 in_stack_fffffffffffff1e0;
  int in_stack_fffffffffffff1e4;
  char *in_stack_fffffffffffff1e8;
  undefined4 in_stack_fffffffffffff1f0;
  undefined4 in_stack_fffffffffffff1f4;
  char *in_stack_fffffffffffff1f8;
  undefined7 in_stack_fffffffffffff260;
  undefined4 in_stack_fffffffffffff270;
  long lVar7;
  uint32_t asset_index;
  void *fund_handle_00;
  char *in_stack_fffffffffffff288;
  string *local_c98;
  string *in_stack_fffffffffffff480;
  string *in_stack_fffffffffffff488;
  allocator *in_stack_fffffffffffff490;
  string *in_stack_fffffffffffff498;
  AssertHelper local_a38;
  Message local_a30;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  uint32_t *in_stack_fffffffffffff5e0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff5e8;
  double in_stack_fffffffffffff5f0;
  char *in_stack_fffffffffffff5f8;
  void *in_stack_fffffffffffff600;
  void *in_stack_fffffffffffff608;
  AssertHelper local_9e8;
  Message local_9e0;
  undefined4 local_9d4;
  AssertionResult local_9d0;
  AssertHelper local_9c0;
  Message local_9b8;
  AssertionResult local_9b0;
  AssertHelper local_9a0;
  Message local_998;
  undefined4 local_98c;
  AssertionResult local_988;
  char *local_978;
  AssertHelper local_970;
  Message local_968;
  AssertionResult local_960;
  AssertHelper local_950;
  Message local_948;
  undefined4 local_93c;
  AssertionResult local_938;
  AssertHelper local_928;
  Message local_920;
  undefined4 local_914;
  AssertionResult local_910;
  AssertHelper local_900;
  Message local_8f8;
  undefined4 local_8ec;
  AssertionResult local_8e8;
  undefined8 local_8d8;
  char *local_8d0;
  undefined4 local_8c4;
  undefined8 local_8c0;
  AssertHelper local_8b8;
  Message local_8b0;
  undefined4 local_8a4;
  AssertionResult local_8a0;
  AssertHelper local_890;
  Message local_888;
  undefined4 local_87c;
  AssertionResult local_878;
  string local_868;
  AssertHelper local_848;
  Message local_840;
  undefined4 local_834;
  AssertionResult local_830;
  string local_820;
  AssertHelper local_800;
  Message local_7f8;
  undefined4 local_7ec;
  AssertionResult local_7e8;
  string local_7d8;
  AssertHelper local_7b8;
  Message local_7b0;
  undefined4 local_7a4;
  AssertionResult local_7a0;
  string local_790;
  AssertHelper local_770;
  Message local_768;
  undefined4 local_75c;
  AssertionResult local_758;
  reference local_748;
  CfdTestFundElementsUtxoVector *local_740;
  __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
  local_738;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *local_730;
  AssertHelper local_728;
  Message local_720;
  undefined8 local_718;
  AssertionResult local_710;
  AssertHelper local_700;
  Message local_6f8;
  undefined4 local_6ec;
  AssertionResult local_6e8;
  void *local_6d8;
  string local_6d0;
  undefined4 local_6ac;
  char *local_6a8;
  string local_6a0;
  AssertHelper local_680;
  Message local_678;
  undefined1 local_669;
  AssertionResult local_668;
  AssertHelper local_658;
  Message local_650;
  undefined4 local_644;
  AssertionResult local_640;
  int local_62c;
  long local_628;
  allocator local_61b [2];
  undefined1 local_619;
  undefined1 local_618;
  undefined1 local_617;
  allocator local_616;
  allocator local_615;
  undefined1 local_614;
  undefined1 local_613;
  allocator local_612;
  allocator local_611;
  undefined1 local_610;
  undefined1 local_60f;
  allocator local_60e;
  allocator local_60d;
  undefined1 local_60c;
  undefined1 local_60b;
  allocator local_60a;
  allocator local_609;
  undefined1 local_608;
  undefined1 local_607;
  allocator local_606;
  allocator local_605;
  undefined1 local_604;
  undefined1 local_603;
  allocator local_602;
  allocator local_601;
  undefined1 local_600;
  undefined1 local_5ff;
  allocator local_5fe;
  allocator local_5fd;
  undefined1 local_5fc;
  undefined1 local_5fb;
  allocator local_5fa;
  allocator local_5f9;
  undefined1 local_5f8;
  undefined1 local_5f7;
  allocator local_5f6;
  allocator local_5f5;
  undefined1 local_5f4;
  undefined1 local_5f3;
  allocator local_5f2;
  allocator local_5f1;
  undefined1 local_5f0;
  undefined1 local_5ef;
  allocator local_5ee;
  allocator local_5ed;
  undefined1 local_5ec;
  undefined1 local_5eb;
  allocator local_5ea;
  allocator local_5e9;
  string *local_5e8;
  string local_5e0 [32];
  undefined4 local_5c0;
  undefined8 local_5b8;
  string local_5b0;
  string local_590 [32];
  string local_570 [32];
  undefined4 local_550;
  undefined8 local_548;
  string sStack_540;
  string asStack_520 [32];
  string local_500 [32];
  undefined4 local_4e0;
  undefined8 local_4d8;
  string sStack_4d0;
  string asStack_4b0 [32];
  string local_490 [32];
  undefined4 local_470;
  undefined8 local_468;
  string sStack_460;
  string asStack_440 [32];
  string local_420 [32];
  undefined4 local_400;
  undefined8 local_3f8;
  string sStack_3f0;
  string asStack_3d0 [32];
  string local_3b0 [32];
  undefined4 local_390;
  undefined8 local_388;
  string sStack_380;
  string asStack_360 [32];
  string local_340 [112];
  string local_2d0 [32];
  undefined4 local_2b0;
  undefined8 local_2a8;
  string sStack_2a0;
  string asStack_280 [32];
  string local_260 [32];
  undefined4 local_240;
  undefined8 local_238;
  string sStack_230;
  string asStack_210 [32];
  string local_1f0 [32];
  undefined4 local_1d0;
  undefined8 local_1c8;
  string sStack_1c0;
  string asStack_1a0 [32];
  string local_180 [32];
  undefined4 local_160;
  undefined8 local_158;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  string local_110 [16];
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  string asStack_c0 [32];
  string *local_a0;
  undefined8 local_98;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28;
  
  pcVar6 = &stack0xfffffffffffff108;
  if ((TestBody()::exp_dummy_asset_a == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_a), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_28,
               "aa00000000000000000000000000000000000000000000000000000000000000",&local_29);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&TestBody::exp_dummy_asset_a,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_a,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::exp_dummy_asset_a);
  }
  if ((TestBody()::exp_dummy_asset_b == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_b), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,
               "bb00000000000000000000000000000000000000000000000000000000000000",&local_61);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&TestBody::exp_dummy_asset_b,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_b,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::exp_dummy_asset_b);
  }
  if ((TestBody()::exp_dummy_asset_c == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_c), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,
               "cc00000000000000000000000000000000000000000000000000000000000000",&local_89);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&TestBody::exp_dummy_asset_c,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_c,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::exp_dummy_asset_c);
  }
  if ((TestBody()::kFundCoinSelectElementsTestVector3 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3), iVar3 != 0)) {
    local_619 = 1;
    local_5e8 = local_5e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_5e0,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
               &local_5e9);
    local_5ec = 1;
    local_5c0 = 0;
    local_5b8 = 0x12a05f20;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_5b0,&TestBody::exp_dummy_asset_a);
    local_5eb = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_590,
               "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
               &local_5ea);
    local_5eb = 0;
    local_5ec = 0;
    local_5e8 = local_570;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_570,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
               &local_5ed);
    local_5f0 = 1;
    local_550 = 0;
    local_548 = 0x4a817c8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_540,&TestBody::exp_dummy_asset_a);
    local_5ef = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_520,
               "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
               &local_5ee);
    local_5ef = 0;
    local_5f0 = 0;
    local_5e8 = local_500;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_500,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
               &local_5f1);
    local_5f4 = 1;
    local_4e0 = 0;
    local_4d8 = 1250000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_4d0,&TestBody::exp_dummy_asset_a);
    local_5f3 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_4b0,
               "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
               &local_5f2);
    local_5f3 = 0;
    local_5f4 = 0;
    local_5e8 = local_490;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_490,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
               &local_5f5);
    local_5f8 = 1;
    local_470 = 0;
    local_468 = 0x2540be4;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_460,&TestBody::exp_dummy_asset_a);
    local_5f7 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_440,
               "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
               &local_5f6);
    local_5f7 = 0;
    local_5f8 = 0;
    local_5e8 = local_420;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_420,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
               &local_5f9);
    local_5fc = 1;
    local_400 = 0;
    local_3f8 = 0x9502f90;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_3f0,&TestBody::exp_dummy_asset_a);
    local_5fb = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_3d0,
               "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
               &local_5fa);
    local_5fb = 0;
    local_5fc = 0;
    local_5e8 = local_3b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3b0,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
               &local_5fd);
    local_600 = 1;
    local_390 = 0;
    local_388 = 2500000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_380,&TestBody::exp_dummy_asset_a);
    local_5ff = 1;
    in_stack_fffffffffffff498 = asStack_360;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff498,
               "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
               &local_5fe);
    local_5ff = 0;
    local_600 = 0;
    psVar4 = local_340;
    in_stack_fffffffffffff490 = &local_601;
    in_stack_fffffffffffff488 = psVar4;
    local_5e8 = psVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff488,
               "0000000000000000000000000000000000000000000000000000000000000b01",
               in_stack_fffffffffffff490);
    local_604 = 1;
    in_stack_fffffffffffff480 = psVar4;
    *(undefined4 *)(psVar4 + 0x20) = 0;
    *(undefined8 *)(psVar4 + 0x28) = 0x19abe00;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)(psVar4 + 0x30),&TestBody::exp_dummy_asset_b);
    local_603 = 1;
    psVar4 = in_stack_fffffffffffff480 + 0x50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (psVar4,"sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))"
               ,&local_602);
    local_603 = 0;
    local_604 = 0;
    local_5e8 = local_2d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2d0,"0000000000000000000000000000000000000000000000000000000000000b02",
               &local_605);
    local_608 = 1;
    local_2b0 = 0;
    local_2a8 = 750000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_2a0,&TestBody::exp_dummy_asset_b);
    local_607 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_280,
               "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
               &local_606);
    local_607 = 0;
    local_608 = 0;
    local_5e8 = local_260;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_260,"0000000000000000000000000000000000000000000000000000000000000b03",
               &local_609);
    local_60c = 1;
    local_240 = 0;
    local_238 = 0x14a61a62;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_230,&TestBody::exp_dummy_asset_b);
    local_60b = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_210,
               "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
               &local_60a);
    local_60b = 0;
    local_60c = 0;
    local_5e8 = local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f0,"0000000000000000000000000000000000000000000000000000000000000b04",
               &local_60d);
    local_610 = 1;
    local_1d0 = 0;
    local_1c8 = 0x119ed3e;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_1c0,&TestBody::exp_dummy_asset_b);
    local_60f = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_1a0,
               "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
               &local_60e);
    local_60f = 0;
    local_610 = 0;
    local_5e8 = local_180;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_180,"0000000000000000000000000000000000000000000000000000000000000c01",
               &local_611);
    local_614 = 1;
    local_160 = 0;
    local_158 = 0x23e8eb8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&stack0xfffffffffffffeb0,&TestBody::exp_dummy_asset_c);
    local_613 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffed0,
               "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
               &local_612);
    local_613 = 0;
    local_614 = 0;
    local_5e8 = local_110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_110,"0000000000000000000000000000000000000000000000000000000000000c02",
               &local_615);
    local_618 = 1;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&stack0xffffffffffffff20,&TestBody::exp_dummy_asset_c);
    local_617 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_c0,
               "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
               &local_616);
    local_617 = 0;
    local_618 = 0;
    local_619 = 0;
    local_a0 = local_5e0;
    local_98 = 0xc;
    std::allocator<CfdTestFundElementsUtxoVector>::allocator
              ((allocator<CfdTestFundElementsUtxoVector> *)0x3d6a61);
    __l._M_len = (size_type)in_stack_fffffffffffff150;
    __l._M_array = in_stack_fffffffffffff148;
    std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>::
    vector(in_stack_fffffffffffff140,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
    std::allocator<CfdTestFundElementsUtxoVector>::~allocator
              ((allocator<CfdTestFundElementsUtxoVector> *)0x3d6a94);
    local_c98 = (string *)&local_a0;
    do {
      local_c98 = local_c98 + -0x70;
      TestBody::CfdTestFundElementsUtxoVector::~CfdTestFundElementsUtxoVector
                ((CfdTestFundElementsUtxoVector *)
                 CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    } while (local_c98 != local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_616);
    std::allocator<char>::~allocator((allocator<char> *)&local_615);
    std::allocator<char>::~allocator((allocator<char> *)&local_612);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    std::allocator<char>::~allocator((allocator<char> *)&local_60e);
    std::allocator<char>::~allocator((allocator<char> *)&local_60d);
    std::allocator<char>::~allocator((allocator<char> *)&local_60a);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    std::allocator<char>::~allocator((allocator<char> *)&local_606);
    std::allocator<char>::~allocator((allocator<char> *)&local_605);
    std::allocator<char>::~allocator((allocator<char> *)&local_602);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::allocator<char>::~allocator((allocator<char> *)&local_5fe);
    std::allocator<char>::~allocator((allocator<char> *)&local_5fd);
    std::allocator<char>::~allocator((allocator<char> *)&local_5fa);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f6);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f5);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f2);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ee);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ed);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ea);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    __cxa_atexit(std::
                 vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                 ::~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
    __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
  }
  if ((TestBody()::kExpTxData_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::kExpTxData_abi_cxx11_,
               "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
               ,local_61b);
    std::allocator<char>::~allocator((allocator<char> *)local_61b);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
  }
  CfdInitialize();
  local_628 = 0;
  local_62c = CfdCreateHandle(in_stack_fffffffffffff128);
  local_644 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
             (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d76e3);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x703,pcVar5);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message((Message *)0x3d7746);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d779b);
  local_669 = local_628 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
             (bool *)in_stack_fffffffffffff108,(type *)0x3d77cf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_668);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6a0,(internal *)&local_668,(AssertionResult *)"(NULL == handle)","true",
               "false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x704,pcVar5);
    testing::internal::AssertHelper::operator=(&local_680,&local_678);
    testing::internal::AssertHelper::~AssertHelper(&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    testing::Message::~Message((Message *)0x3d78cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7946);
  local_6a8 = 
  "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
  ;
  local_6ac = 3;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_6d0,&TestBody::exp_dummy_asset_a);
  local_6d8 = (void *)0x0;
  std::__cxx11::string::c_str();
  local_62c = CfdInitializeFundRawTx
                        (in_stack_fffffffffffff498,(int)((ulong)in_stack_fffffffffffff490 >> 0x20),
                         (uint32_t)in_stack_fffffffffffff490,(char *)in_stack_fffffffffffff488,
                         (void **)in_stack_fffffffffffff480);
  local_6ec = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
             (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7ac1);
    testing::internal::AssertHelper::AssertHelper
              (&local_700,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x70e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper(&local_700);
    testing::Message::~Message((Message *)0x3d7b24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7b79);
  local_718 = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((char *)in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
             (void **)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
             (void **)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_710);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7c21);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x70f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    testing::Message::~Message((Message *)0x3d7c84);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7cdc);
  if (local_62c == 0) {
    local_730 = &TestBody::kFundCoinSelectElementsTestVector3;
    local_738._M_current =
         (CfdTestFundElementsUtxoVector *)
         std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
         ::begin(in_stack_fffffffffffff108);
    local_740 = (CfdTestFundElementsUtxoVector *)
                std::
                vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                ::end(in_stack_fffffffffffff108);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                               *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                              (__normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                               *)in_stack_fffffffffffff108), bVar1) {
      local_748 = __gnu_cxx::
                  __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                  ::operator*(&local_738);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff108 =
           (vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *)
           std::__cxx11::string::c_str();
      local_62c = CfdAddUtxoForFundRawTx
                            (in_stack_fffffffffffff140,
                             (void *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138),
                             (char *)CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                             (uint32_t)((ulong)in_stack_fffffffffffff128 >> 0x20),
                             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                             (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                             in_stack_fffffffffffff150);
      local_75c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff128,
                 (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                 (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                 (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
      if (!bVar1) {
        testing::Message::Message(&local_768);
        in_stack_fffffffffffff288 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3d7ec4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_770,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x718,in_stack_fffffffffffff288);
        testing::internal::AssertHelper::operator=(&local_770,&local_768);
        testing::internal::AssertHelper::~AssertHelper(&local_770);
        testing::Message::~Message((Message *)0x3d7f27);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7f7c);
      __gnu_cxx::
      __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
      ::operator++(&local_738);
    }
    lVar7 = local_628;
    fund_handle_00 = local_6d8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_790,&TestBody::exp_dummy_asset_a);
    asset_index = (uint32_t)((ulong)lVar7 >> 0x20);
    std::__cxx11::string::c_str();
    in_stack_fffffffffffff128 = (void **)0x89756b;
    in_stack_fffffffffffff120 = 0;
    in_stack_fffffffffffff118 = 0;
    in_stack_fffffffffffff110 = 0;
    iVar3 = CfdAddTxInputForFundRawTx
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                       ,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffeb8,in_stack_ffffffffffffff00,
                       (bool)in_stack_fffffffffffffeb7,(bool)in_stack_fffffffffffffeb6,
                       (bool)in_stack_fffffffffffffeb5,in_stack_ffffffffffffff20,
                       in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                       (char *)in_stack_ffffffffffffff38);
    local_62c = iVar3;
    std::__cxx11::string::~string((string *)&local_790);
    local_7a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_7b0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8134);
      testing::internal::AssertHelper::AssertHelper
                (&local_7b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x721,pcVar5);
      testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
      testing::internal::AssertHelper::~AssertHelper(&local_7b8);
      testing::Message::~Message((Message *)0x3d8197);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d81ef);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_7d8,&TestBody::exp_dummy_asset_a);
    std::__cxx11::string::c_str();
    local_62c = CfdAddTargetAmountForFundRawTx
                          (in_stack_fffffffffffff288,fund_handle_00,asset_index,
                           CONCAT44(iVar3,in_stack_fffffffffffff270),pcVar6,
                           (char *)CONCAT17(uVar2,in_stack_fffffffffffff260));
    std::__cxx11::string::~string((string *)&local_7d8);
    local_7ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7e8);
    if (!bVar1) {
      testing::Message::Message(&local_7f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8349);
      testing::internal::AssertHelper::AssertHelper
                (&local_800,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x726,pcVar5);
      testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
      testing::internal::AssertHelper::~AssertHelper(&local_800);
      testing::Message::~Message((Message *)0x3d83ac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8404);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_820,&TestBody::exp_dummy_asset_b);
    std::__cxx11::string::c_str();
    local_62c = CfdAddTargetAmountForFundRawTx
                          (in_stack_fffffffffffff288,fund_handle_00,asset_index,
                           CONCAT44(iVar3,in_stack_fffffffffffff270),pcVar6,
                           (char *)CONCAT17(uVar2,in_stack_fffffffffffff260));
    std::__cxx11::string::~string((string *)&local_820);
    local_834 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_830);
    if (!bVar1) {
      testing::Message::Message(&local_840);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8561);
      testing::internal::AssertHelper::AssertHelper
                (&local_848,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x72a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_848,&local_840);
      testing::internal::AssertHelper::~AssertHelper(&local_848);
      testing::Message::~Message((Message *)0x3d85c4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d861c);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_868,&TestBody::exp_dummy_asset_c);
    std::__cxx11::string::c_str();
    local_62c = CfdAddTargetAmountForFundRawTx
                          (in_stack_fffffffffffff288,fund_handle_00,asset_index,
                           CONCAT44(iVar3,in_stack_fffffffffffff270),pcVar6,
                           (char *)CONCAT17(uVar2,in_stack_fffffffffffff260));
    std::__cxx11::string::~string((string *)&local_868);
    local_87c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_878);
    if (!bVar1) {
      testing::Message::Message(&local_888);
      in_stack_fffffffffffff1f8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d8779);
      testing::internal::AssertHelper::AssertHelper
                (&local_890,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x72e,in_stack_fffffffffffff1f8);
      testing::internal::AssertHelper::operator=(&local_890,&local_888);
      testing::internal::AssertHelper::~AssertHelper(&local_890);
      testing::Message::~Message((Message *)0x3d87dc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8834);
    local_62c = CfdSetOptionFundRawTx
                          (in_stack_fffffffffffff1f8,
                           (void *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
                           (int)((ulong)in_stack_fffffffffffff1e8 >> 0x20),
                           CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                           in_stack_fffffffffffff1d8,(bool)in_stack_fffffffffffff1d7);
    local_8a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
    if (!bVar1) {
      testing::Message::Message(&local_8b0);
      in_stack_fffffffffffff1e8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d8917);
      testing::internal::AssertHelper::AssertHelper
                (&local_8b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x732,in_stack_fffffffffffff1e8);
      testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
      testing::internal::AssertHelper::~AssertHelper(&local_8b8);
      testing::Message::~Message((Message *)0x3d897a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d89d2);
    local_8c0 = 0;
    local_8c4 = 0;
    local_8d0 = (char *)0x0;
    local_8d8 = 0x3fc3333333333333;
    in_stack_fffffffffffff1e4 =
         CfdFinalizeFundRawTx
                   (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                    in_stack_fffffffffffff5f0,(int64_t *)in_stack_fffffffffffff5e8.ptr_,
                    in_stack_fffffffffffff5e0,
                    (char **)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    local_8ec = 0;
    local_62c = in_stack_fffffffffffff1e4;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff128,
               (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
               (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e8);
    in_stack_fffffffffffff1e0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff1e0);
    if (!bVar1) {
      testing::Message::Message(&local_8f8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8b03);
      testing::internal::AssertHelper::AssertHelper
                (&local_900,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x73b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
      testing::internal::AssertHelper::~AssertHelper(&local_900);
      testing::Message::~Message((Message *)0x3d8b66);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8bbb);
    if (local_62c == 0) {
      local_914 = 0x26a;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff128,
                 (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                 (int *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                 (long *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
      if (!bVar1) {
        testing::Message::Message(&local_920);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8c70);
        testing::internal::AssertHelper::AssertHelper
                  (&local_928,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_928,&local_920);
        testing::internal::AssertHelper::~AssertHelper(&local_928);
        testing::Message::~Message((Message *)0x3d8cd3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8d28);
      local_93c = 3;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff128,
                 (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                 (int *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                 (uint *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_938);
      if (!bVar1) {
        testing::Message::Message(&local_948);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8dcf);
        testing::internal::AssertHelper::AssertHelper
                  (&local_950,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_950,&local_948);
        testing::internal::AssertHelper::~AssertHelper(&local_950);
        testing::Message::~Message((Message *)0x3d8e32);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8e87);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_960,"kExpTxData.c_str()","output_tx_hex",pcVar6,local_8d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_960);
      if (!bVar1) {
        testing::Message::Message(&local_968);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d8f2a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_970,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73f,pcVar6);
        testing::internal::AssertHelper::operator=(&local_970,&local_968);
        testing::internal::AssertHelper::~AssertHelper(&local_970);
        testing::Message::~Message((Message *)0x3d8f8d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8fe2);
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    }
    else {
      local_62c = CfdGetLastErrorCode(in_stack_fffffffffffff148);
      if (local_62c != 0) {
        local_978 = (char *)0x0;
        local_62c = CfdGetLastErrorMessage
                              (in_stack_fffffffffffff1a8,
                               (char **)CONCAT44(local_62c,in_stack_fffffffffffff1a0));
        local_98c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff128,
                   (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                   (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                   (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_988);
        if (!bVar1) {
          testing::Message::Message(&local_998);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d9107);
          testing::internal::AssertHelper::AssertHelper
                    (&local_9a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x746,pcVar6);
          testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
          testing::internal::AssertHelper::~AssertHelper(&local_9a0);
          testing::Message::~Message((Message *)0x3d916a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d91bf);
        testing::internal::CmpHelperSTREQ((internal *)&local_9b0,"\"\"","str_buffer","",local_978);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9b0);
        if (!bVar1) {
          testing::Message::Message(&local_9b8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d925a);
          testing::internal::AssertHelper::AssertHelper
                    (&local_9c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x747,pcVar6);
          testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
          testing::internal::AssertHelper::~AssertHelper(&local_9c0);
          testing::Message::~Message((Message *)0x3d92b7);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d930c);
        CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
        local_978 = (char *)0x0;
      }
    }
  }
  local_62c = CfdFreeFundRawTxHandle
                        (in_stack_fffffffffffff1e8,
                         (void *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0));
  local_9d4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
             (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9d0);
  if (!bVar1) {
    testing::Message::Message(&local_9e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d93f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x74e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_9e8,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper(&local_9e8);
    testing::Message::~Message((Message *)0x3d9451);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d94a6);
  std::__cxx11::string::~string((string *)&local_6d0);
  local_62c = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  this_00 = (AssertionResult *)&stack0xfffffffffffff5e0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
             (int *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_a30);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3d9719);
    testing::internal::AssertHelper::AssertHelper
              (&local_a38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x756,pcVar6);
    testing::internal::AssertHelper::operator=(&local_a38,&local_a30);
    testing::internal::AssertHelper::~AssertHelper(&local_a38);
    testing::Message::~Message((Message *)0x3d9776);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d97cb);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Check1) {
  // from cfd-go
  struct CfdTestFundElementsUtxoVector {
    std::string txid;
    uint32_t vout;
    int64_t amount;
    std::string asset;
    std::string descriptor;
  };
  static ConfidentialAssetId exp_dummy_asset_a("aa00000000000000000000000000000000000000000000000000000000000000");
  static ConfidentialAssetId exp_dummy_asset_b("bb00000000000000000000000000000000000000000000000000000000000000");
  static ConfidentialAssetId exp_dummy_asset_c("cc00000000000000000000000000000000000000000000000000000000000000");

  static const std::vector<CfdTestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  CfdInitialize();
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  try {
    const char* tx = "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000";
    uint32_t target_asset_count = 3;
    auto fee_asset = exp_dummy_asset_a.GetHex();
    void* fund_handle = nullptr;
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkLiquidv1, target_asset_count,
        fee_asset.c_str(), &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
    if (ret == kCfdSuccess) {
      for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
        ret = CfdAddUtxoForFundRawTx(
            handle, fund_handle,
            test_data.txid.c_str(), test_data.vout,
            test_data.amount,
            test_data.descriptor.c_str(),
            test_data.asset.c_str());
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdAddTxInputForFundRawTx(handle, fund_handle,
          "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
          112340000,
          "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x",
          exp_dummy_asset_a.GetHex().c_str(),
          false, false, false, "", 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 115800000,
          exp_dummy_asset_a.GetHex().c_str(),
          "ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 1, 347180040,
          exp_dummy_asset_b.GetHex().c_str(),
          "ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 2, 37654100,
          exp_dummy_asset_c.GetHex().c_str(),
          "ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);

      int64_t tx_fee_amount = 0;
      uint32_t append_txout_count = 0;
      char* output_tx_hex = nullptr;
      double effective_fee_rate = 0.15;
      ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
          effective_fee_rate, &tx_fee_amount, &append_txout_count,
          &output_tx_hex);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(618, tx_fee_amount);
        EXPECT_EQ(3, append_txout_count);
        EXPECT_STREQ(kExpTxData.c_str(), output_tx_hex);
        CfdFreeStringBuffer(output_tx_hex);
      } else {
        ret = CfdGetLastErrorCode(handle);
        if (ret != kCfdSuccess) {
          char* str_buffer = NULL;
          ret = CfdGetLastErrorMessage(handle, &str_buffer);
          EXPECT_EQ(kCfdSuccess, ret);
          EXPECT_STREQ("", str_buffer);
          CfdFreeStringBuffer(str_buffer);
          str_buffer = NULL;
        }
      }
    }
    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}